

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void cpy_C4(void)

{
  ubyte uVar1;
  byte bVar2;
  byte local_a;
  ubyte neartemp;
  uint flags;
  
  except = '\0';
  bVar2 = getbyte(pc);
  uVar1 = RAM[bVar2];
  asm("push ax");
  asm("CLC");
  if (carry_f == '\0') {
    asm("STC");
  }
  _AL = y_reg;
  _AH = uVar1;
  asm("cmp AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("pop AX");
  carry_f = local_a & 1 ^ 1;
  result_f = local_a & 0xc0 ^ 0x40;
  pc = pc + 1;
  return;
}

Assistant:

void cpy_C4(void) {
    uint flags;
    ubyte neartemp;
    CLE;
    neartemp = RAM[getbyte(pc)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = y_reg;
    _AH = neartemp;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}